

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.cpp
# Opt level: O3

void duckdb_zstd::ZSTD_deriveSeqStoreChunk
               (seqStore_t *resultSeqStore,seqStore_t *originalSeqStore,size_t startIdx,
               size_t endIdx)

{
  seqDef *psVar1;
  size_t sVar2;
  long lVar3;
  seqStore_t *psVar4;
  seqStore_t *psVar5;
  
  psVar4 = originalSeqStore;
  psVar5 = resultSeqStore;
  for (lVar3 = 10; lVar3 != 0; lVar3 = lVar3 + -1) {
    psVar5->sequencesStart = psVar4->sequencesStart;
    psVar4 = (seqStore_t *)&psVar4->sequences;
    psVar5 = (seqStore_t *)&psVar5->sequences;
  }
  if (startIdx != 0) {
    resultSeqStore->sequences = originalSeqStore->sequencesStart + startIdx;
    sVar2 = ZSTD_countSeqStoreLiteralsBytes(resultSeqStore);
    resultSeqStore->litStart = resultSeqStore->litStart + sVar2;
  }
  if (originalSeqStore->longLengthType != ZSTD_llt_none) {
    if (originalSeqStore->longLengthPos < startIdx || endIdx < originalSeqStore->longLengthPos) {
      resultSeqStore->longLengthType = ZSTD_llt_none;
    }
    else {
      resultSeqStore->longLengthPos = resultSeqStore->longLengthPos - (int)startIdx;
    }
  }
  resultSeqStore->sequencesStart = originalSeqStore->sequencesStart + startIdx;
  psVar1 = originalSeqStore->sequencesStart;
  resultSeqStore->sequences = psVar1 + endIdx;
  if ((long)originalSeqStore->sequences - (long)psVar1 >> 3 != endIdx) {
    sVar2 = ZSTD_countSeqStoreLiteralsBytes(resultSeqStore);
    resultSeqStore->lit = resultSeqStore->litStart + sVar2;
  }
  resultSeqStore->llCode = resultSeqStore->llCode + startIdx;
  resultSeqStore->mlCode = resultSeqStore->mlCode + startIdx;
  resultSeqStore->ofCode = resultSeqStore->ofCode + startIdx;
  return;
}

Assistant:

static void ZSTD_deriveSeqStoreChunk(seqStore_t* resultSeqStore,
                               const seqStore_t* originalSeqStore,
                                     size_t startIdx, size_t endIdx)
{
    *resultSeqStore = *originalSeqStore;
    if (startIdx > 0) {
        resultSeqStore->sequences = originalSeqStore->sequencesStart + startIdx;
        resultSeqStore->litStart += ZSTD_countSeqStoreLiteralsBytes(resultSeqStore);
    }

    /* Move longLengthPos into the correct position if necessary */
    if (originalSeqStore->longLengthType != ZSTD_llt_none) {
        if (originalSeqStore->longLengthPos < startIdx || originalSeqStore->longLengthPos > endIdx) {
            resultSeqStore->longLengthType = ZSTD_llt_none;
        } else {
            resultSeqStore->longLengthPos -= (U32)startIdx;
        }
    }
    resultSeqStore->sequencesStart = originalSeqStore->sequencesStart + startIdx;
    resultSeqStore->sequences = originalSeqStore->sequencesStart + endIdx;
    if (endIdx == (size_t)(originalSeqStore->sequences - originalSeqStore->sequencesStart)) {
        /* This accounts for possible last literals if the derived chunk reaches the end of the block */
        assert(resultSeqStore->lit == originalSeqStore->lit);
    } else {
        size_t const literalsBytes = ZSTD_countSeqStoreLiteralsBytes(resultSeqStore);
        resultSeqStore->lit = resultSeqStore->litStart + literalsBytes;
    }
    resultSeqStore->llCode += startIdx;
    resultSeqStore->mlCode += startIdx;
    resultSeqStore->ofCode += startIdx;
}